

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsStatus __thiscall HEkk::undualize(HEkk *this)

{
  vector<signed_char,_std::allocator<signed_char>_> *__x;
  vector<signed_char,_std::allocator<signed_char>_> *__x_00;
  SimplexBasis *this_00;
  HighsSparseMatrix *this_01;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  bool bVar7;
  char cVar8;
  HighsStatus HVar9;
  long lVar10;
  long lVar11;
  char cVar12;
  HighsInt iCol;
  size_type __n;
  HighsInt iRow;
  int iVar13;
  int local_ec;
  vector<signed_char,_std::allocator<signed_char>_> dual_nonbasic_flag;
  HighsSparseMatrix local_b8;
  vector<signed_char,_std::allocator<signed_char>_> dual_nonbasic_move;
  
  HVar9 = kOk;
  if ((this->status_).is_dualized == true) {
    iVar13 = (this->lp_).num_col_;
    iVar3 = this->original_num_col_;
    iVar4 = this->original_num_row_;
    __x = &(this->basis_).nonbasicFlag_;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(&dual_nonbasic_flag,__x);
    __x_00 = &(this->basis_).nonbasicMove_;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(&dual_nonbasic_move,__x_00);
    __n = (long)iVar4 + (long)iVar3;
    std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_assign
              (__x,__n,&kIllegalFlagValue);
    std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_assign
              (__x_00,__n,&kIllegalMoveValue);
    this_00 = &this->basis_;
    std::vector<int,_std::allocator<int>_>::resize(&this_00->basicIndex_,0);
    local_ec = this->original_num_row_;
    for (local_b8.format_ = 0; (int)local_b8.format_ < this->original_num_col_;
        local_b8.format_ = local_b8.format_ + kColwise) {
      dVar1 = (this->original_col_lower_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[(int)local_b8.format_];
      dVar2 = (this->original_col_upper_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[(int)local_b8.format_];
      cVar8 = dual_nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)(int)local_b8.format_ + (long)iVar13];
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        bVar7 = highs_isInfinity(-dVar1);
        if (!bVar7) {
          bVar7 = highs_isInfinity(dVar2);
          if (bVar7) {
            if (cVar8 == '\0') {
LAB_0032b069:
              cVar12 = '\x01';
              cVar8 = '\x01';
              goto LAB_0032b040;
            }
          }
          else {
            if (cVar8 == '\0') {
              local_ec = local_ec + 1;
              goto LAB_0032b069;
            }
            lVar10 = (long)local_ec;
            local_ec = local_ec + 1;
            if (dual_nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar10] == '\0') {
              cVar8 = -1;
              goto LAB_0032b071;
            }
          }
LAB_0032b02f:
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this_00->basicIndex_,(value_type_conflict2 *)&local_b8);
          cVar12 = '\0';
          goto LAB_0032b03e;
        }
        bVar7 = highs_isInfinity(dVar2);
        if (cVar8 != '\0') goto LAB_0032b02f;
        cVar8 = bVar7 + -1;
LAB_0032b071:
        cVar12 = '\x01';
      }
      else {
        if (cVar8 != '\0') goto LAB_0032b02f;
        cVar12 = '\x01';
LAB_0032b03e:
        cVar8 = '\0';
      }
LAB_0032b040:
      (__x->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)local_b8.format_] = cVar12;
      (__x_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)local_b8.format_] = cVar8;
    }
    for (lVar10 = 0; iVar13 = this->original_num_row_, lVar10 < iVar13; lVar10 = lVar10 + 1) {
      dVar1 = (this->original_row_lower_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->original_row_upper_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10];
      cVar8 = dual_nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10];
      iVar13 = (int)lVar10;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        bVar7 = highs_isInfinity(-dVar1);
        if (bVar7) {
          bVar7 = highs_isInfinity(dVar2);
          if (cVar8 != '\0') goto LAB_0032b11e;
          cVar8 = !bVar7;
          goto LAB_0032b151;
        }
        bVar7 = highs_isInfinity(dVar2);
        if (bVar7) {
          if (cVar8 == '\0') {
LAB_0032b14b:
            cVar8 = -1;
            goto LAB_0032b151;
          }
        }
        else {
          if (cVar8 == '\0') {
            local_ec = local_ec + 1;
            goto LAB_0032b14b;
          }
          lVar11 = (long)local_ec;
          local_ec = local_ec + 1;
          if (dual_nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11] == '\0') {
            cVar8 = '\x01';
            goto LAB_0032b151;
          }
        }
LAB_0032b11e:
        local_b8.format_ = this->original_num_col_ + iVar13;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this_00->basicIndex_,(int *)&local_b8);
        iVar3 = this->original_num_col_;
        cVar12 = '\0';
        cVar8 = '\0';
      }
      else {
        if (cVar8 != '\0') goto LAB_0032b11e;
        cVar8 = '\0';
LAB_0032b151:
        iVar3 = this->original_num_col_;
        cVar12 = '\x01';
      }
      (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar3 + iVar13] = cVar12;
      (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)iVar13 + (long)this->original_num_col_] = cVar8
      ;
    }
    (this->lp_).sense_ = (uint)((this->lp_).sense_ != kMinimize) * 2 + kMaximize;
    (this->lp_).num_col_ = this->original_num_col_;
    (this->lp_).num_row_ = iVar13;
    (this->lp_).offset_ = this->original_offset_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lp_).col_cost_,&this->original_col_cost_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lp_).col_lower_,&this->original_col_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lp_).col_upper_,&this->original_col_upper_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lp_).row_lower_,&this->original_row_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lp_).row_upper_,&this->original_row_upper_);
    HighsSparseMatrix::HighsSparseMatrix(&local_b8);
    std::vector<int,_std::allocator<int>_>::resize
              (&local_b8.start_,(long)this->original_num_row_ + 1);
    std::vector<int,_std::allocator<int>_>::resize(&local_b8.index_,(long)this->original_num_nz_);
    std::vector<double,_std::allocator<double>_>::resize
              (&local_b8.value_,(long)this->original_num_nz_);
    piVar5 = (this->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar10 = 0; lVar10 <= this->original_num_row_; lVar10 = lVar10 + 1) {
      local_b8.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = piVar5[lVar10];
    }
    piVar5 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (lVar10 = 0; lVar10 < this->original_num_nz_; lVar10 = lVar10 + 1) {
      local_b8.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = piVar5[lVar10];
      local_b8.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = pdVar6[lVar10];
    }
    local_b8.num_col_ = this->original_num_col_;
    local_b8.num_row_ = this->original_num_row_;
    local_b8.format_ = kRowwise;
    this_01 = &(this->lp_).a_matrix_;
    HighsSparseMatrix::operator=(this_01,&local_b8);
    HighsSparseMatrix::ensureColwise(this_01);
    if (this->original_num_row_ !=
        (int)((ulong)((long)(this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      printf("HEkk::undualize: Have %d basic variables, not %d\n");
    }
    clearEkkDualize(this);
    (this->status_).is_dualized = false;
    (this->status_).has_basis = true;
    (this->status_).has_ar_matrix = false;
    (this->status_).has_nla = false;
    (this->status_).has_invert = false;
    iVar13 = this->iteration_count_;
    HVar9 = solve(this,false);
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                 "Solving the primal LP (%s) using the optimal basis of its dual required %d simplex iterations\n"
                 ,(this->lp_).model_name_._M_dataplus._M_p,
                 (ulong)(uint)(this->iteration_count_ - iVar13));
    HighsSparseMatrix::~HighsSparseMatrix(&local_b8);
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&dual_nonbasic_move.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&dual_nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  }
  return HVar9;
}

Assistant:

HighsStatus HEkk::undualize() {
  if (!this->status_.is_dualized) return HighsStatus::kOk;
  HighsInt dual_num_col = lp_.num_col_;
  HighsInt primal_num_tot = original_num_col_ + original_num_row_;
  // These two aren't used (yet)
  // vector<double>& dual_work_dual = info_.workDual_;
  // vector<double>& primal_work_value = info_.workValue_;
  // Take copies of the nonbasic information for the dual LP, since
  // its values will be over-written in constructing the corresponding
  // data for the primal problem
  vector<int8_t> dual_nonbasic_flag = basis_.nonbasicFlag_;
  vector<int8_t> dual_nonbasic_move = basis_.nonbasicMove_;
  vector<HighsInt>& primal_basic_index = basis_.basicIndex_;
  vector<int8_t>& primal_nonbasic_flag = basis_.nonbasicFlag_;
  vector<int8_t>& primal_nonbasic_move = basis_.nonbasicMove_;
  basis_.nonbasicFlag_.assign(primal_num_tot, kIllegalFlagValue);
  basis_.nonbasicMove_.assign(primal_num_tot, kIllegalMoveValue);
  basis_.basicIndex_.resize(0);
  // The number of dual rows is the number of primal columns, so all
  // dual basic variables are nonbasic in the primal problem.
  //
  // If there are extra dual columns due to upper bounds on boxed
  // primal variables/constraints, there will be an excess of dual
  // nonbasic variables for the required primal basic variables.
  //
  // For each pair of dual variables associated with a boxed primal
  // variable/constraint:
  //
  // * If one is basic then it yields a nonbasic primal variable, at
  //   a bound given by the basic dual
  //
  // * If both are nonbasic, then they yield a basic primal variable
  //
  // Keep track of the dual column added to handle upper bounds on
  // boxed variables/constraints
  HighsInt upper_bound_col = original_num_row_;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    HighsInt dual_variable = dual_num_col + iCol;
    bool dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
    if (lower == upper) {
      // Fixed
      if (dual_basic) move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (dual_basic) {
          // Primal variable is nonbasic at its lower bound
          move = kNonbasicMoveUp;
        } else {
          // Look at the corresponding dual variable for the upper bound
          dual_variable = upper_bound_col;
          dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
          if (dual_basic) {
            // Primal variable is nonbasic at its upper bound
            move = kNonbasicMoveDn;
          }
        }
        upper_bound_col++;
      } else {
        // Lower (since upper bound is infinite)
        if (dual_basic) move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      if (dual_basic) move = kNonbasicMoveDn;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      if (dual_basic) {
        assert(4 == 0);
        move = kNonbasicMoveZe;
      }
    }
    if (dual_basic) {
      // Primal nonbasic column from basic dual row
      assert(move != kIllegalMoveValue);
      primal_nonbasic_flag[iCol] = kNonbasicFlagTrue;
      primal_nonbasic_move[iCol] = move;
    } else {
      // Primal basic column from nonbasic dual row
      primal_basic_index.push_back(iCol);
      primal_nonbasic_flag[iCol] = kNonbasicFlagFalse;
      primal_nonbasic_move[iCol] = 0;
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    int8_t move = kIllegalMoveValue;
    HighsInt dual_variable = iRow;
    bool dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      if (dual_basic) {
        move = kNonbasicMoveZe;
      }
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (dual_basic) {
          // Primal variable is nonbasic at its lower bound
          move = kNonbasicMoveDn;
        } else {
          // Look at the corresponding dual variable for the upper bound
          dual_variable = upper_bound_col;
          dual_basic = dual_nonbasic_flag[dual_variable] == kNonbasicFlagFalse;
          if (dual_basic) {
            // Primal variable is nonbasic at its upper bound
            move = kNonbasicMoveUp;
          }
        }
        upper_bound_col++;
      } else {
        // Lower (since upper bound is infinite)
        if (dual_basic) {
          move = kNonbasicMoveDn;
        }
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      if (dual_basic) {
        move = kNonbasicMoveUp;
      }
    } else {
      // FREE
      if (dual_basic) {
        assert(14 == 0);
        move = kNonbasicMoveZe;
      }
      // Shouldn't get free rows, but handle them anyway
    }
    if (dual_basic) {
      // Primal nonbasic column from basic dual row
      assert(move != kIllegalMoveValue);
      primal_nonbasic_flag[original_num_col_ + iRow] = kNonbasicFlagTrue;
      primal_nonbasic_move[original_num_col_ + iRow] = move;
    } else {
      // Primal basic column from nonbasic dual row
      primal_basic_index.push_back(original_num_col_ + iRow);
      primal_nonbasic_flag[original_num_col_ + iRow] = kNonbasicFlagFalse;
      primal_nonbasic_move[original_num_col_ + iRow] = 0;
    }
  }
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.col.resize(original_num_col_);
      lp_.scale_.row.resize(original_num_row_);
      lp_.scale_.num_col = original_num_col_;
      lp_.scale_.num_row = original_num_row_;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = original_num_col_;
  lp_.num_row_ = original_num_row_;
  // Restore the original offset
  lp_.offset_ = original_offset_;
  // Copy back the costs and bounds
  lp_.col_cost_ = original_col_cost_;
  lp_.col_lower_ = original_col_lower_;
  lp_.col_upper_ = original_col_upper_;
  lp_.row_lower_ = original_row_lower_;
  lp_.row_upper_ = original_row_upper_;
  // The primal constraint matrix is available row-wise as the first
  // original_num_row_ vectors of the dual constraint matrix
  HighsSparseMatrix primal_matrix;
  primal_matrix.start_.resize(original_num_row_ + 1);
  primal_matrix.index_.resize(original_num_nz_);
  primal_matrix.value_.resize(original_num_nz_);

  for (HighsInt iCol = 0; iCol < original_num_row_ + 1; iCol++)
    primal_matrix.start_[iCol] = lp_.a_matrix_.start_[iCol];
  for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++) {
    primal_matrix.index_[iEl] = lp_.a_matrix_.index_[iEl];
    primal_matrix.value_[iEl] = lp_.a_matrix_.value_[iEl];
  }
  primal_matrix.num_col_ = original_num_col_;
  primal_matrix.num_row_ = original_num_row_;
  primal_matrix.format_ = MatrixFormat::kRowwise;
  // Copy the row-wise primal LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = primal_matrix;
  lp_.a_matrix_.ensureColwise();
  // Some sanity checks
  assert(lp_.num_col_ == original_num_col_);
  assert(lp_.num_row_ == original_num_row_);
  assert(lp_.a_matrix_.numNz() == original_num_nz_);
  HighsInt num_basic_variables = primal_basic_index.size();
  bool num_basic_variables_ok = num_basic_variables == original_num_row_;
  if (!num_basic_variables_ok)
    printf("HEkk::undualize: Have %d basic variables, not %d\n",
           (int)num_basic_variables, (int)original_num_row_);
  assert(num_basic_variables_ok);

  // Clear the data retained when solving dual LP
  clearEkkDualize();
  status_.is_dualized = false;
  // Now solve with this basis. Should just be a case of reinverting
  // and re-solving for optimal primal and dual values, but
  // numerically marginal LPs will need clean-up
  status_.has_basis = true;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  status_.has_invert = false;
  HighsInt primal_solve_iteration_count = -iteration_count_;
  HighsStatus return_status = solve();
  primal_solve_iteration_count += iteration_count_;
  //  if (primal_solve_iteration_count)
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving the primal LP (%s) using the optimal basis of its dual "
               "required %d simplex iterations\n",
               lp_.model_name_.c_str(), (int)primal_solve_iteration_count);
  return return_status;
}